

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

ecs_entity_t
ecs_find_in_type(ecs_world_t *world,ecs_type_t type,ecs_entity_t component,ecs_entity_t flags)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  ecs_type_t type_00;
  ulong uVar5;
  ulong uVar6;
  undefined8 local_40;
  
  uVar2 = ecs_vector_count(type);
  pvVar4 = _ecs_vector_first(type,8,0x10);
  if ((int)uVar2 < 1) {
    local_40 = 0;
  }
  else {
    uVar6 = 0;
    do {
      uVar5 = *(ulong *)((long)pvVar4 + uVar6 * 8);
      if ((flags == 0) || (iVar3 = 4, (uVar5 & flags) == flags)) {
        uVar5 = uVar5 & 0xffffffffffffff;
        if (component != 0) {
          type_00 = ecs_get_type(world,uVar5);
          _Var1 = ecs_type_has_entity(world,type_00,component);
          if (!_Var1) {
            iVar3 = (uint)!_Var1 << 2;
            goto LAB_0010e93c;
          }
        }
        iVar3 = 1;
        local_40 = uVar5;
      }
LAB_0010e93c:
      if (iVar3 != 4) goto LAB_0010e94b;
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
    iVar3 = 0;
LAB_0010e94b:
    if (iVar3 == 0) {
      local_40 = 0;
    }
  }
  return local_40;
}

Assistant:

ecs_entity_t ecs_find_in_type(
    ecs_world_t *world,
    ecs_type_t type,
    ecs_entity_t component,
    ecs_entity_t flags)
{
    ecs_vector_each(type, ecs_entity_t, c_ptr, {
        ecs_entity_t c = *c_ptr;

        if (flags) {
            if ((c & flags) != flags) {
                continue;
            }
        }

        ecs_entity_t e = c & ECS_COMPONENT_MASK;

        if (component) {
           ecs_type_t component_type = ecs_get_type(world, e);
           if (!ecs_type_has_entity(world, component_type, component)) {
               continue;
           }
        }

        return e;
    });

    return 0;
}